

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<int,char_const(&)[3],std::__cxx11::string&>
                   (string *__return_storage_ptr__,int *a,char (*b) [3],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  cmAlphaNum *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_a0 [56];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  size_t local_50;
  char (*local_48) [3];
  undefined8 local_40;
  size_type local_38;
  pointer local_30;
  undefined8 local_28;
  
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_a0,*a);
  pcVar1 = (cmAlphaNum *)(local_a0 + 0x10);
  if ((cmAlphaNum *)local_a0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_a0._0_8_;
  }
  local_68.first._M_str = (char *)pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_a0;
  if ((cmAlphaNum *)local_a0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_a0._0_8_;
  }
  local_68.first._M_len = (pcVar1->View_)._M_len;
  local_68.second =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_;
  local_50 = strlen(*b);
  local_40 = 0;
  local_30 = (args->_M_dataplus)._M_p;
  local_38 = args->_M_string_length;
  local_28 = 0;
  views._M_len = 3;
  views._M_array = &local_68;
  local_48 = b;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}